

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_tas(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGv_i32 pTVar1;
  TCGv_i32 ea_result;
  TCGv_i32 addr;
  TCGv_i32 src1;
  TCGv_i32 dest;
  TCGContext_conflict2 *tcg_ctx;
  DisasContext_conflict2 *pDStack_18;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  dest = (TCGv_i32)s->uc->tcg_ctx;
  tcg_ctx._6_2_ = insn;
  pDStack_18 = s;
  s_local = (DisasContext_conflict2 *)env;
  src1 = tcg_temp_new_i32((TCGContext_conflict2 *)dest);
  addr = gen_ea((CPUM68KState_conflict *)s_local,pDStack_18,tcg_ctx._6_2_,0,
                *(TCGv_i32 *)(dest + 0x94f8),&ea_result,EA_LOADS,
                (uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (addr == *(TCGv_i32 *)(dest + 0x94f8)) {
    gen_addr_fault(pDStack_18);
  }
  else {
    gen_logic_cc(pDStack_18,addr,0);
    tcg_gen_ori_i32_m68k((TCGContext_conflict2 *)dest,src1,addr,0x80);
    pTVar1 = gen_ea((CPUM68KState_conflict *)s_local,pDStack_18,tcg_ctx._6_2_,0,src1,&ea_result,
                    EA_STORE,(uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
    if (pTVar1 == *(TCGv_i32 *)(dest + 0x94f8)) {
      gen_addr_fault(pDStack_18);
    }
    else {
      tcg_temp_free_i32((TCGContext_conflict2 *)dest,src1);
    }
  }
  return;
}

Assistant:

DISAS_INSN(tas)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv dest;
    TCGv src1;
    TCGv addr;

    dest = tcg_temp_new(tcg_ctx);
    SRC_EA(env, src1, OS_BYTE, 1, &addr);
    gen_logic_cc(s, src1, OS_BYTE);
    tcg_gen_ori_i32(tcg_ctx, dest, src1, 0x80);
    DEST_EA(env, insn, OS_BYTE, dest, &addr);
    tcg_temp_free(tcg_ctx, dest);
}